

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::MacCountersToJson_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,MacCounters *aMacCounters)

{
  Json json;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_ot::commissioner::MacCounters_&,_ot::commissioner::MacCounters,_0>
            (&json,(MacCounters *)this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(__return_storage_ptr__,&json,4,' ',false,strict);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  return __return_storage_ptr__;
}

Assistant:

std::string MacCountersToJson(const MacCounters &aMacCounters)
{
    Json json = aMacCounters;
    return json.dump(JSON_INDENT_DEFAULT);
}